

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  char cVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  StkId pSVar5;
  Proto *p;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  Table *t;
  StkId pSVar9;
  size_t srclen;
  char *pcVar10;
  char *pcVar11;
  CallInfo *ci;
  uint pc;
  long lVar12;
  Table *x_;
  bool bVar13;
  int local_64;
  TValue local_40;
  
  if (*what == '>') {
    pSVar9 = (StkId)((L->top).offset + -0x10);
    what = what + 1;
    (L->top).p = pSVar9;
    ci = (CallInfo *)0x0;
  }
  else {
    ci = ar->i_ci;
    pSVar9 = (ci->func).p;
  }
  if (((pSVar9->val).tt_ | 0x20) == 0x66) {
    lVar12 = *(long *)pSVar9;
  }
  else {
    lVar12 = 0;
  }
  local_64 = 1;
  pcVar10 = what;
  do {
    cVar1 = *pcVar10;
    switch(cVar1) {
    case 'l':
      iVar7 = -1;
      if ((ci != (CallInfo *)0x0) && ((ci->callstatus & 2) == 0)) {
        iVar7 = getcurrentline(ci);
      }
      ar->currentline = iVar7;
      break;
    case 'm':
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_0010650f_caseD_6d:
      local_64 = 0;
      break;
    case 'n':
      if ((ci != (CallInfo *)0x0) && ((ci->callstatus & 0x20) == 0)) {
        pcVar11 = funcnamefromcall(L,ci->previous,&ar->name);
        ar->namewhat = pcVar11;
        if (pcVar11 != (char *)0x0) break;
      }
      ar->namewhat = "";
      ar->name = (char *)0x0;
      break;
    case 'r':
      if ((ci == (CallInfo *)0x0) || ((ci->callstatus & 0x100) == 0)) {
        ar->ftransfer = 0;
        ar->ntransfer = 0;
      }
      else {
        ar->ftransfer = (ci->u2).transferinfo.ftransfer;
        ar->ntransfer = (ci->u2).transferinfo.ntransfer;
      }
      break;
    case 't':
      if (ci == (CallInfo *)0x0) {
        bVar6 = 0;
      }
      else {
        bVar6 = (byte)ci->callstatus & 0x20;
      }
      ar->istailcall = bVar6;
      break;
    case 'u':
      if (lVar12 == 0) {
        ar->nups = '\0';
      }
      else {
        ar->nups = *(uchar *)(lVar12 + 10);
        if (*(char *)(lVar12 + 8) == '\x06') {
          ar->isvararg = *(char *)(*(long *)(lVar12 + 0x18) + 0xb);
          ar->nparams = *(uchar *)(*(long *)(lVar12 + 0x18) + 10);
          break;
        }
      }
      ar->nparams = '\0';
      ar->isvararg = '\x01';
      break;
    default:
      if (cVar1 != 'L') {
        if (cVar1 == 'S') {
          if ((lVar12 == 0) || (*(char *)(lVar12 + 8) != '\x06')) {
            pcVar11 = "=[C]";
            ar->source = "=[C]";
            ar->srclen = 4;
            ar->linedefined = -1;
            ar->lastlinedefined = -1;
            pcVar8 = "C";
            srclen = 4;
          }
          else {
            lVar2 = *(long *)(lVar12 + 0x18);
            lVar3 = *(long *)(lVar2 + 0x70);
            if (lVar3 == 0) {
              pcVar11 = "=?";
              ar->source = "=?";
              srclen = 2;
            }
            else {
              pcVar11 = (char *)(lVar3 + 0x18);
              ar->source = pcVar11;
              srclen = (size_t)*(byte *)(lVar3 + 0xb);
              if (srclen == 0xff) {
                srclen = *(size_t *)(lVar3 + 0x10);
              }
            }
            ar->srclen = srclen;
            uVar4 = *(undefined8 *)(lVar2 + 0x2c);
            ar->linedefined = (int)uVar4;
            ar->lastlinedefined = (int)((ulong)uVar4 >> 0x20);
            pcVar8 = "Lua";
            if ((int)uVar4 == 0) {
              pcVar8 = "main";
            }
          }
          ar->what = pcVar8;
          luaO_chunkid(ar->short_src,pcVar11,srclen);
        }
        else if (cVar1 != 'f') {
          if (cVar1 == '\0') {
            pcVar10 = strchr(what,0x66);
            if (pcVar10 != (char *)0x0) {
              pSVar5 = (L->top).p;
              *(Value *)pSVar5 = (pSVar9->val).value_;
              (pSVar5->val).tt_ = (pSVar9->val).tt_;
              (L->top).p = (StkId)((L->top).offset + 0x10);
            }
            pcVar10 = strchr(what,0x4c);
            if (pcVar10 != (char *)0x0) {
              if ((lVar12 == 0) || (*(char *)(lVar12 + 8) != '\x06')) {
                *(undefined1 *)((L->top).offset + 8) = 0;
                (L->top).p = (StkId)((L->top).offset + 0x10);
              }
              else {
                p = *(Proto **)(lVar12 + 0x18);
                iVar7 = p->linedefined;
                t = luaH_new(L);
                pSVar9 = (L->top).p;
                *(Table **)pSVar9 = t;
                (pSVar9->val).tt_ = 'E';
                (L->top).p = (StkId)((L->top).offset + 0x10);
                if (p->lineinfo != (ls_byte *)0x0) {
                  local_40.tt_ = '\x11';
                  bVar13 = p->is_vararg != '\0';
                  if (bVar13) {
                    iVar7 = nextline(p,iVar7,0);
                  }
                  for (pc = (uint)bVar13; (int)pc < p->sizelineinfo; pc = pc + 1) {
                    iVar7 = nextline(p,iVar7,pc);
                    luaH_setint(L,t,(long)iVar7,&local_40);
                  }
                }
              }
            }
            return local_64;
          }
          goto switchD_0010650f_caseD_6d;
        }
      }
    }
    pcVar10 = pcVar10 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}